

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

int __thiscall CConsole::ParseArgs(CConsole *this,CResult *pResult,char *pFormat)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  CConsole *str;
  CConsole *pCVar4;
  char cVar5;
  CConsole *pCVar6;
  uint uVar7;
  CConsole *str_00;
  long in_FS_OFFSET;
  char Command;
  byte local_41;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_41 = *pFormat;
  local_40 = pFormat;
  if (local_41 == 0) {
LAB_001b74fd:
    uVar7 = 0;
LAB_001b7506:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return uVar7;
  }
  uVar7 = 0;
  bVar1 = false;
  str_00 = (CConsole *)pResult->m_pArgsStart;
  do {
    bVar2 = local_41;
    if (local_41 == 0x3f) {
      bVar1 = true;
      str = str_00;
    }
    else {
      str = (CConsole *)str_skip_whitespaces((char *)str_00);
      cVar5 = *(char *)&(str->super_IConsole).super_IInterface._vptr_IInterface;
      if (cVar5 == '\"') {
        str = (CConsole *)((long)&(str->super_IConsole).super_IInterface._vptr_IInterface + 1);
        uVar7 = (pResult->super_IResult).m_NumArgs;
        (pResult->super_IResult).m_NumArgs = uVar7 + 1;
        pResult->m_apArgs[uVar7] = (char *)str;
        pCVar4 = str;
        do {
          cVar5 = *(char *)&(str->super_IConsole).super_IInterface._vptr_IInterface;
          if (cVar5 == '\\') {
            pCVar6 = (CConsole *)
                     ((long)&(str->super_IConsole).super_IInterface._vptr_IInterface + 1);
            cVar5 = *(char *)((long)&(str->super_IConsole).super_IInterface._vptr_IInterface + 1);
            if ((cVar5 != '\"') && (cVar5 != '\\')) {
              cVar5 = '\\';
              pCVar6 = str;
            }
          }
          else {
            if (cVar5 == '\0') {
              uVar7 = 1;
              goto LAB_001b7506;
            }
            pCVar6 = str;
            this = str_00;
            if (cVar5 == '\"') goto LAB_001b74c0;
          }
          *(char *)&(pCVar4->super_IConsole).super_IInterface._vptr_IInterface = cVar5;
          pCVar4 = (CConsole *)
                   ((long)&(pCVar4->super_IConsole).super_IInterface._vptr_IInterface + 1);
          str = (CConsole *)((long)&(pCVar6->super_IConsole).super_IInterface._vptr_IInterface + 1);
        } while( true );
      }
      if (cVar5 == '\0') {
        if (!bVar1) {
          uVar7 = 1;
        }
        goto LAB_001b7506;
      }
      uVar7 = (pResult->super_IResult).m_NumArgs;
      (pResult->super_IResult).m_NumArgs = uVar7 + 1;
      pResult->m_apArgs[uVar7] = (char *)str;
      if (bVar2 < 0x72) {
        if ((bVar2 == 0x66) || (bVar2 == 0x69)) {
LAB_001b74ab:
          pCVar4 = (CConsole *)str_skip_to_whitespace((char *)str);
          str_00 = str;
          str = pCVar4;
        }
      }
      else {
        if (bVar2 == 0x73) goto LAB_001b74ab;
        if (bVar2 == 0x72) {
          str_utf8_trim_whitespaces_right((char *)str);
          goto LAB_001b74fd;
        }
      }
      this = str_00;
      pCVar4 = str;
      if (*(char *)&(str->super_IConsole).super_IInterface._vptr_IInterface != '\0') {
LAB_001b74c0:
        *(char *)&(pCVar4->super_IConsole).super_IInterface._vptr_IInterface = '\0';
        str = (CConsole *)((long)&(str->super_IConsole).super_IInterface._vptr_IInterface + 1);
      }
    }
    bVar3 = NextParam(this,(char *)&local_41,&local_40);
    uVar7 = (uint)bVar3;
    if ((bVar3) || (str_00 = str, local_41 == 0)) goto LAB_001b7506;
  } while( true );
}

Assistant:

int CConsole::ParseArgs(CResult *pResult, const char *pFormat)
{
	char Command = *pFormat;
	char *pStr;
	int Optional = 0;
	int Error = 0;

	pStr = pResult->m_pArgsStart;

	while(!Error)
	{
		if(!Command)
			break;

		if(Command == '?')
			Optional = 1;
		else
		{
			pStr = str_skip_whitespaces(pStr);

			if(!(*pStr)) // error, non optional command needs value
			{
				if(!Optional)
				{
					Error = 1;
				}
				break;
			}

			// add token
			if(*pStr == '"')
			{
				char *pDst;
				pStr++;
				pResult->AddArgument(pStr);

				pDst = pStr; // we might have to process escape data
				while(1)
				{
					if(pStr[0] == '"')
						break;
					else if(pStr[0] == '\\')
					{
						if(pStr[1] == '\\')
							pStr++; // skip due to escape
						else if(pStr[1] == '"')
							pStr++; // skip due to escape
					}
					else if(pStr[0] == 0)
						return 1; // return error

					*pDst = *pStr;
					pDst++;
					pStr++;
				}

				// write null termination
				*pDst = 0;


				pStr++;
			}
			else
			{
				pResult->AddArgument(pStr);

				if(Command == 'r') // rest of the string
				{
					str_utf8_trim_whitespaces_right(pStr);
					break;
				}
				else if(Command == 'i') // validate int
					pStr = str_skip_to_whitespace(pStr);
				else if(Command == 'f') // validate float
					pStr = str_skip_to_whitespace(pStr);
				else if(Command == 's') // validate string
					pStr = str_skip_to_whitespace(pStr);

				if(pStr[0] != 0) // check for end of string
				{
					pStr[0] = 0;
					pStr++;
				}
			}
		}

		// fetch next command
		Error = NextParam(&Command, pFormat);
	}

	return Error;
}